

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiPlatformMonitor * ImGui::GetViewportPlatformMonitor(ImGuiViewport *viewport_p)

{
  short sVar1;
  
  sVar1 = *(short *)&viewport_p[1].WorkPos.y;
  if ((-1 < sVar1) && ((int)sVar1 < (GImGui->PlatformIO).Monitors.Size)) {
    return (GImGui->PlatformIO).Monitors.Data + (uint)(int)sVar1;
  }
  return &GImGui->FallbackMonitor;
}

Assistant:

const ImGuiPlatformMonitor* ImGui::GetViewportPlatformMonitor(ImGuiViewport* viewport_p)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)viewport_p;
    int monitor_idx = viewport->PlatformMonitor;
    if (monitor_idx >= 0 && monitor_idx < g.PlatformIO.Monitors.Size)
        return &g.PlatformIO.Monitors[monitor_idx];
    return &g.FallbackMonitor;
}